

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECPrivateKey.cpp
# Opt level: O0

bool __thiscall ECPrivateKey::deserialise(ECPrivateKey *this,ByteString *serialised)

{
  size_t sVar1;
  long *in_RDI;
  ByteString dD;
  ByteString dEC;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined1 local_68 [40];
  undefined1 local_40 [63];
  byte local_1;
  
  ByteString::chainDeserialise
            ((ByteString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  ByteString::chainDeserialise
            ((ByteString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  sVar1 = ByteString::size((ByteString *)0x14f6d4);
  if (sVar1 != 0) {
    sVar1 = ByteString::size((ByteString *)0x14f6f0);
    if (sVar1 != 0) {
      (**(code **)(*in_RDI + 0x50))(in_RDI,local_40);
      (**(code **)(*in_RDI + 0x48))(in_RDI,local_68);
      local_1 = 1;
      goto LAB_0014f778;
    }
  }
  local_1 = 0;
LAB_0014f778:
  ByteString::~ByteString((ByteString *)0x14f782);
  ByteString::~ByteString((ByteString *)0x14f78c);
  return (bool)(local_1 & 1);
}

Assistant:

bool ECPrivateKey::deserialise(ByteString& serialised)
{
	ByteString dEC = ByteString::chainDeserialise(serialised);
	ByteString dD = ByteString::chainDeserialise(serialised);

	if ((dEC.size() == 0) ||
	    (dD.size() == 0))
	{
		return false;
	}

	setEC(dEC);
	setD(dD);

	return true;
}